

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O1

void Llb_ImgSchedule(Vec_Ptr_t *vSupps,Vec_Ptr_t **pvQuant0,Vec_Ptr_t **pvQuant1,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  undefined8 *puVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  
  iVar6 = vSupps->nSize;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < iVar6 - 1U) {
    iVar5 = iVar6;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)iVar5 * 8);
  }
  pVVar1->pArray = ppvVar2;
  *pvQuant0 = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)iVar5 << 3);
  }
  pVVar1->pArray = ppvVar2;
  *pvQuant1 = pVVar1;
  if (0 < vSupps->nSize) {
    iVar6 = 0;
    do {
      pVVar1 = *pvQuant0;
      puVar3 = (undefined8 *)malloc(0x10);
      *puVar3 = 0x10;
      pvVar4 = malloc(0x40);
      puVar3[1] = pvVar4;
      uVar7 = pVVar1->nCap;
      if (pVVar1->nSize == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x80);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,0x80);
          }
          pVVar1->pArray = ppvVar2;
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar7 * 2;
          if (iVar5 <= (int)uVar7) goto LAB_007d588f;
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,(ulong)uVar7 << 4);
          }
          pVVar1->pArray = ppvVar2;
        }
        pVVar1->nCap = iVar5;
      }
LAB_007d588f:
      iVar5 = pVVar1->nSize;
      pVVar1->nSize = iVar5 + 1;
      pVVar1->pArray[iVar5] = puVar3;
      pVVar1 = *pvQuant1;
      puVar3 = (undefined8 *)malloc(0x10);
      *puVar3 = 0x10;
      pvVar4 = malloc(0x40);
      puVar3[1] = pvVar4;
      uVar7 = pVVar1->nCap;
      if (pVVar1->nSize == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x80);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,0x80);
          }
          pVVar1->pArray = ppvVar2;
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar7 * 2;
          if (iVar5 <= (int)uVar7) goto LAB_007d5935;
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,(ulong)uVar7 << 4);
          }
          pVVar1->pArray = ppvVar2;
        }
        pVVar1->nCap = iVar5;
      }
LAB_007d5935:
      iVar5 = pVVar1->nSize;
      pVVar1->nSize = iVar5 + 1;
      pVVar1->pArray[iVar5] = puVar3;
      iVar6 = iVar6 + 1;
    } while (iVar6 < vSupps->nSize);
    if (0 < vSupps->nSize) {
      lVar11 = (long)*(int *)((long)*vSupps->pArray + 4);
      if (0 < lVar11) {
        uVar7 = 0xffffffff;
        lVar10 = 0;
        do {
          if ((long)vSupps->nSize < 1) {
            iVar6 = 0;
          }
          else {
            lVar9 = 0;
            iVar6 = 0;
            do {
              if (*(int *)((long)vSupps->pArray[lVar9] + 4) <= lVar10) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              bVar12 = *(int *)(*(long *)((long)vSupps->pArray[lVar9] + 8) + lVar10 * 4) != 0;
              if (bVar12) {
                uVar7 = (uint)lVar9;
              }
              iVar6 = iVar6 + (uint)bVar12;
              lVar9 = lVar9 + 1;
            } while (vSupps->nSize != lVar9);
          }
          if (iVar6 != 0) {
            if (iVar6 == 1) {
              if ((int)uVar7 < 0) goto LAB_007d5b3f;
              pVVar1 = *pvQuant0;
            }
            else {
              if ((int)uVar7 < 0) goto LAB_007d5b3f;
              pVVar1 = *pvQuant1;
            }
            if (pVVar1->nSize <= (int)uVar7) goto LAB_007d5b3f;
            Vec_IntPush((Vec_Int_t *)pVVar1->pArray[uVar7],(int)lVar10);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar11);
      }
      if (fVerbose != 0) {
        if (0 < vSupps->nSize) {
          uVar8 = 0;
          do {
            printf("%2d : Quant0 = ",uVar8 & 0xffffffff);
            pVVar1 = *pvQuant0;
            if ((long)pVVar1->nSize <= (long)uVar8) goto LAB_007d5b3f;
            lVar11 = 0;
            while (lVar11 < *(int *)((long)pVVar1->pArray[uVar8] + 4)) {
              printf("%d ",(ulong)*(uint *)(*(long *)((long)pVVar1->pArray[uVar8] + 8) + lVar11 * 4)
                    );
              lVar11 = lVar11 + 1;
              pVVar1 = *pvQuant0;
              if ((long)pVVar1->nSize <= (long)uVar8) goto LAB_007d5b3f;
            }
            putchar(10);
            uVar8 = uVar8 + 1;
          } while ((long)uVar8 < (long)vSupps->nSize);
        }
        if ((fVerbose != 0) && (0 < vSupps->nSize)) {
          uVar8 = 0;
          do {
            printf("%2d : Quant1 = ",uVar8 & 0xffffffff);
            pVVar1 = *pvQuant1;
            if ((long)pVVar1->nSize <= (long)uVar8) goto LAB_007d5b3f;
            lVar11 = 0;
            while (lVar11 < *(int *)((long)pVVar1->pArray[uVar8] + 4)) {
              printf("%d ",(ulong)*(uint *)(*(long *)((long)pVVar1->pArray[uVar8] + 8) + lVar11 * 4)
                    );
              lVar11 = lVar11 + 1;
              pVVar1 = *pvQuant1;
              if ((long)pVVar1->nSize <= (long)uVar8) goto LAB_007d5b3f;
            }
            putchar(10);
            uVar8 = uVar8 + 1;
          } while ((long)uVar8 < (long)vSupps->nSize);
        }
      }
      return;
    }
  }
LAB_007d5b3f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Llb_ImgSchedule( Vec_Ptr_t * vSupps, Vec_Ptr_t ** pvQuant0, Vec_Ptr_t ** pvQuant1, int fVerbose )
{
    Vec_Int_t * vOne;
    int nVarsAll, Counter, iSupp = -1, Entry, i, k;
    // start quantification arrays
    *pvQuant0 = Vec_PtrAlloc( Vec_PtrSize(vSupps) );
    *pvQuant1 = Vec_PtrAlloc( Vec_PtrSize(vSupps) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
    {
        Vec_PtrPush( *pvQuant0, Vec_IntAlloc(16) );
        Vec_PtrPush( *pvQuant1, Vec_IntAlloc(16) );
    }
    // count how many times each var appears
    nVarsAll = Vec_IntSize( (Vec_Int_t *)Vec_PtrEntry(vSupps, 0) );
    for ( i = 0; i < nVarsAll; i++ )
    {
        Counter = 0;
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            if ( Vec_IntEntry(vOne, i) )
            {
                iSupp = k;
                Counter++;
            }
        if ( Counter == 0 )
            continue;
        if ( Counter == 1 )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(*pvQuant0, iSupp), i );
        else // if ( Counter > 1 )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(*pvQuant1, iSupp), i );
    }

    if ( fVerbose )
    for ( i = 0; i < Vec_PtrSize(vSupps); i++ )
    {
        printf( "%2d : Quant0 = ", i );
        Vec_IntForEachEntry( (Vec_Int_t *)Vec_PtrEntry(*pvQuant0, i), Entry, k )
            printf( "%d ", Entry );
        printf( "\n" );
    }

    if ( fVerbose )
    for ( i = 0; i < Vec_PtrSize(vSupps); i++ )
    {
        printf( "%2d : Quant1 = ", i );
        Vec_IntForEachEntry( (Vec_Int_t *)Vec_PtrEntry(*pvQuant1, i), Entry, k )
            printf( "%d ", Entry );
        printf( "\n" );
    }
}